

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformations_t *
opengv::absolute_pose::gp3p(AbsoluteAdapterBase *adapter,size_t index0,size_t index1,size_t index2)

{
  transformations_t *in_RDI;
  undefined4 in_R8D;
  vector<int,_std::allocator<int>_> indices;
  vector<int,_std::allocator<int>_> *in_stack_00000260;
  AbsoluteAdapterBase *in_stack_00000268;
  transformations_t *this;
  undefined4 in_stack_ffffffffffffffa0;
  
  this = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6d0418);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this,(value_type_conflict *)in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this,(value_type_conflict *)in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this,(value_type_conflict *)in_RDI);
  gp3p(in_stack_00000268,in_stack_00000260);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_R8D,in_stack_ffffffffffffffa0));
  return this;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::gp3p(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1,
    size_t index2)
{
  std::vector<int> indices;
  indices.push_back(index0);
  indices.push_back(index1);
  indices.push_back(index2);

  return gp3p(adapter,indices);
}